

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O2

bilingual_str *
util::ErrorString<wallet::MigrationResult>
          (bilingual_str *__return_storage_ptr__,Result<wallet::MigrationResult> *result)

{
  long lVar1;
  variant_alternative_t<0UL,_variant<bilingual_str,_MigrationResult>_> *pvVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(__index_type *)
       ((long)&(result->m_variant).super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> + 0x78) ==
      '\x01') {
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    (__return_storage_ptr__->original)._M_string_length = 0;
    (__return_storage_ptr__->original).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    (__return_storage_ptr__->translated)._M_string_length = 0;
    (__return_storage_ptr__->translated).field_2._M_local_buf[0] = '\0';
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    pvVar2 = std::get<0ul,bilingual_str,wallet::MigrationResult>(&result->m_variant);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      bilingual_str::bilingual_str(__return_storage_ptr__,pvVar2);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str ErrorString(const Result<T>& result)
{
    return result ? bilingual_str{} : std::get<0>(result.m_variant);
}